

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_filesystem.cpp
# Opt level: O0

path * __thiscall Omega_h::filesystem::path::extension(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  string_type *psVar2;
  string local_98 [36];
  undefined4 local_74;
  long local_70;
  size_type last_dot_pos;
  path local_58;
  string local_38 [8];
  string_type filename_str;
  path *this_local;
  
  filename(&local_58,this);
  psVar2 = native_abi_cxx11_(&local_58);
  std::__cxx11::string::string(local_38,(string *)psVar2);
  ~path(&local_58);
  local_70 = std::__cxx11::string::find_last_of((char)local_38,0x2e);
  if (local_70 == -1) {
    memset(__return_storage_ptr__,0,0x20);
    path(__return_storage_ptr__);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,".");
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"..");
      if (!bVar1) {
        if (local_70 == 0) {
          memset(__return_storage_ptr__,0,0x20);
          path(__return_storage_ptr__);
        }
        else {
          std::__cxx11::string::substr((ulong)local_98,(ulong)local_38);
          path(__return_storage_ptr__,local_98);
          std::__cxx11::string::~string((string *)local_98);
        }
        goto LAB_0045ba24;
      }
    }
    memset(__return_storage_ptr__,0,0x20);
    path(__return_storage_ptr__);
  }
LAB_0045ba24:
  local_74 = 1;
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

path path::extension() const {
  auto const filename_str = filename().native();
  auto const last_dot_pos = filename_str.find_last_of('.');
  // If the pathname is either . or .., or if filename() does not contain the .
  // character, then empty path is returned.
  if (last_dot_pos == std::string::npos) return path();
  if (filename_str == "." || filename_str == "..") return path();
  // If the first character in the filename is a period, that period is ignored
  // (a filename like ".profile" is not treated as an extension)
  if (last_dot_pos == 0) return path();
  // If the filename() component of the generic-format path contains a period
  // (.), and is not one of the special filesystem elements dot or dot-dot, then
  // the extension is the substring beginning at the rightmost period (including
  // the period) and until the end of the pathname.
  return filename_str.substr(last_dot_pos, std::string::npos);
}